

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

bitset_container_t * container_to_bitset(container_t *c,uint8_t typecode)

{
  bitset_container_t *pbVar1;
  byte in_SIL;
  bitset_container_t *result;
  
  pbVar1 = (bitset_container_t *)
           (*(code *)(&DAT_001773d0 + *(int *)(&DAT_001773d0 + (ulong)(in_SIL - 1) * 4)))();
  return pbVar1;
}

Assistant:

static inline bitset_container_t *container_to_bitset(container_t *c,
                                                      uint8_t typecode) {
    bitset_container_t *result = NULL;
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return CAST_bitset(c);  // nothing to do
        case ARRAY_CONTAINER_TYPE:
            result = bitset_container_from_array(CAST_array(c));
            return result;
        case RUN_CONTAINER_TYPE:
            result = bitset_container_from_run(CAST_run(c));
            return result;
        case SHARED_CONTAINER_TYPE:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}